

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

bool __thiscall moira::Moira::writeOp<(moira::Mode)2,(moira::Size)1,64ul>(Moira *this,int n,u32 val)

{
  u32 uVar1;
  u32 in_EDX;
  u32 in_ESI;
  Moira *in_RDI;
  bool error;
  u32 ea;
  uint in_stack_ffffffffffffffe0;
  byte bVar2;
  undefined4 in_stack_ffffffffffffffe4;
  Moira *this_00;
  undefined1 local_1;
  
  this_00 = in_RDI;
  uVar1 = computeEA<(moira::Mode)2,(moira::Size)1,0ul>
                    ((Moira *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (u32)((ulong)in_RDI >> 0x20));
  writeM<(moira::Mode)2,(moira::Size)1,64ul>
            (this_00,in_ESI,in_EDX,(bool *)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
  updateAnPD<(moira::Mode)2,(moira::Size)1>(in_RDI,in_ESI);
  bVar2 = (byte)(in_stack_ffffffffffffffe0 >> 0x18);
  if ((in_stack_ffffffffffffffe0 & 0x1000000) == 0) {
    updateAnPI<(moira::Mode)2,(moira::Size)1>(in_RDI,in_ESI);
    local_1 = (bool)((bVar2 ^ 0xff) & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
Moira::writeOp(int n, u32 val)
{
    // Handle non-memory modes
    if (M == MODE_DN) { writeD<S>(n, val); return true;  }
    if (M == MODE_AN) { writeA<S>(n, val); return true;  }
    if (M == MODE_IM) { assert(false);     return false; }

    // Compute effective address
    u32 ea = computeEA<M,S>(n);

    // Write to effective address
    bool error; writeM <M,S,F> (ea, val, error);

    // Emulate -(An) register modification
    updateAnPD<M,S>(n);

    // Early exit in case of an address error
    if (error) return false;
    
    // Emulate (An)+ register modification
    updateAnPI<M,S>(n);
    
    return !error;
}